

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O2

void __thiscall nuraft::buffer::put_raw(buffer *this,byte *ba,size_t len)

{
  uint uVar1;
  ulong uVar2;
  overflow_error *this_00;
  uint uVar3;
  long lStack_20;
  
  uVar1 = *(uint *)this;
  uVar3 = 0x7fffffff;
  if (-1 < (int)uVar1) {
    uVar3 = 0xffff;
  }
  if ((int)uVar1 < 0) {
    uVar2 = (ulong)*(uint *)(this + 4);
    if ((uVar3 & uVar1) - uVar2 < len) goto LAB_00124ab0;
    lStack_20 = 8;
  }
  else {
    uVar2 = (ulong)(uVar1 >> 0x10);
    if ((uVar3 & uVar1) - uVar2 < len) {
LAB_00124ab0:
      this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
      std::overflow_error::overflow_error(this_00,"insufficient buffer to store a raw byte array");
      __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
    }
    lStack_20 = 4;
  }
  memcpy(this + uVar2 + lStack_20,ba,len);
  if (*(int *)this < 0) {
    *(int *)(this + 4) = *(int *)(this + 4) + (int)len;
  }
  else {
    *(short *)(this + 2) = (short)len + (short)((uint)*(int *)this >> 0x10);
  }
  return;
}

Assistant:

void buffer::put_raw(const byte* ba, size_t len) {
    if ( size() - pos() < len) {
        throw std::overflow_error
              ( "insufficient buffer to store a raw byte array" );
    }

    ::memcpy(data(), ba, len);
    __mv_fw_block(this, len);
}